

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O1

void __thiscall bloaty::RangeMapTest_Translation_Test::TestBody(RangeMapTest_Translation_Test *this)

{
  RangeMap *this_00;
  RangeMap *other;
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  pointer *__ptr_2;
  pointer *__ptr;
  long lVar5;
  pointer *__ptr_4;
  long *plVar6;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  initializer_list<bloaty::RangeMapTest::Entry> __l_00;
  initializer_list<bloaty::RangeMapTest::Entry> __l_01;
  initializer_list<bloaty::RangeMapTest::Entry> __l_02;
  initializer_list<bloaty::RangeMapTest::Entry> __l_03;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  AssertHelper local_c8;
  undefined1 local_c0 [8];
  pointer local_b8;
  undefined1 local_a8 [24];
  string local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined8 local_70;
  undefined8 local_68;
  uint64_t local_60;
  long *local_58 [2];
  long local_48 [2];
  RangeMap *local_38;
  
  pcVar4 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"foo","");
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddDualRange(this_00,0x14,5,0x78,(string *)local_a8);
  if ((char *)local_a8._0_8_ != pcVar4) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
  local_a8._0_8_ = (pointer)0x14;
  local_a8._8_8_ = 0x19;
  local_a8._16_8_ = 0x78;
  local_90._0_8_ = &local_80;
  std::__cxx11::string::_M_construct<char_const*>(local_90,"foo","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_a8;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_c0,__l,(allocator_type *)&local_d0);
  RangeMapTest::AssertMapEquals
            (&this->super_RangeMapTest,this_00,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_c0);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._0_8_ != &local_80) {
    operator_delete((void *)local_90._0_8_,local_80._M_allocated_capacity + 1);
  }
  local_a8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"translate me","");
  local_38 = &(this->super_RangeMapTest).map2_;
  other = &(this->super_RangeMapTest).map3_;
  pcVar3 = (char *)0x0;
  local_c0[0] = (internal)
                RangeMap::AddRangeWithTranslation
                          (local_38,0x14,5,(string *)local_a8,this_00,false,other);
  local_b8 = (pointer)0x0;
  if ((char *)local_a8._0_8_ != pcVar4) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  iVar1 = local_c0[0];
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_c0,
               (AssertionResult *)
               "map2_.AddRangeWithTranslation(20, 5, \"translate me\", map_, false, &map3_)","false"
               ,"true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
               ,0x13d,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_b8 != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  if (iVar1 != (internal)0x0) {
    RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
    local_a8._0_8_ = (pointer)0x14;
    local_a8._8_8_ = 0x19;
    local_a8._16_8_ = (this->super_RangeMapTest).kNoTranslation;
    local_90._0_8_ = &local_80;
    std::__cxx11::string::_M_construct<char_const*>(local_90,"translate me","");
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_a8;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_c0,__l_00,(allocator_type *)&local_d0);
    RangeMapTest::AssertMapEquals
              (&this->super_RangeMapTest,local_38,
               (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_c0);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_c0);
    pcVar4 = local_a8 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_,local_80._M_allocated_capacity + 1);
    }
    local_a8._0_8_ = (pointer)0x78;
    local_a8._8_8_ = 0x7d;
    local_a8._16_8_ = (this->super_RangeMapTest).kNoTranslation;
    local_90._0_8_ = &local_80;
    std::__cxx11::string::_M_construct<char_const*>(local_90,"translate me","");
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_a8;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_c0,__l_01,(allocator_type *)&local_d0);
    RangeMapTest::AssertMapEquals
              (&this->super_RangeMapTest,other,
               (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_c0);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_,local_80._M_allocated_capacity + 1);
    }
    local_a8._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"bar","");
    RangeMap::AddDualRange(this_00,1000,0x1e,0x44c,(string *)local_a8);
    if ((char *)local_a8._0_8_ != pcVar4) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    local_a8._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"translate me2","");
    pcVar3 = (char *)0x0;
    local_c0[0] = (internal)
                  RangeMap::AddRangeWithTranslation
                            (local_38,1000,5,(string *)local_a8,this_00,false,other);
    local_b8 = (pointer)0x0;
    if ((char *)local_a8._0_8_ != pcVar4) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    iVar1 = local_c0[0];
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)local_c0,
                 (AssertionResult *)
                 "map2_.AddRangeWithTranslation(1000, 5, \"translate me2\", map_, false, &map3_)",
                 "false","true",pcVar3);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                 ,0x149,(char *)local_a8._0_8_);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8 != (pointer)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    }
    if (iVar1 != (internal)0x0) {
      local_a8._0_8_ = (pointer)0x14;
      local_a8._8_8_ = 0x19;
      local_a8._16_8_ = (this->super_RangeMapTest).kNoTranslation;
      local_90._0_8_ = &local_80;
      std::__cxx11::string::_M_construct<char_const*>(local_90,"translate me","");
      local_70 = 1000;
      local_68 = 0x3ed;
      local_60 = (this->super_RangeMapTest).kNoTranslation;
      plVar6 = local_48;
      local_58[0] = plVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"translate me2","");
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)local_a8;
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
                ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)local_c0,__l_02,(allocator_type *)&local_d0);
      RangeMapTest::AssertMapEquals
                (&this->super_RangeMapTest,local_38,
                 (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)local_c0);
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::
      ~vector((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
              local_c0);
      lVar5 = -0x70;
      do {
        if (plVar6 != (long *)plVar6[-2]) {
          operator_delete((long *)plVar6[-2],*plVar6 + 1);
        }
        plVar6 = plVar6 + -7;
        lVar5 = lVar5 + 0x38;
      } while (lVar5 != 0);
      local_a8._0_8_ = (pointer)0x78;
      local_a8._8_8_ = 0x7d;
      local_a8._16_8_ = (this->super_RangeMapTest).kNoTranslation;
      local_90._0_8_ = &local_80;
      std::__cxx11::string::_M_construct<char_const*>(local_90,"translate me","");
      local_70 = 0x44c;
      local_68 = 0x451;
      local_60 = (this->super_RangeMapTest).kNoTranslation;
      plVar6 = local_48;
      local_58[0] = plVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"translate me2","");
      __l_03._M_len = 2;
      __l_03._M_array = (iterator)local_a8;
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
                ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)local_c0,__l_03,(allocator_type *)&local_d0);
      RangeMapTest::AssertMapEquals
                (&this->super_RangeMapTest,other,
                 (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)local_c0);
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::
      ~vector((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
              local_c0);
      lVar5 = -0x70;
      do {
        if (plVar6 != (long *)plVar6[-2]) {
          operator_delete((long *)plVar6[-2],*plVar6 + 1);
        }
        plVar6 = plVar6 + -7;
        lVar5 = lVar5 + 0x38;
      } while (lVar5 != 0);
      pcVar4 = local_a8 + 0x10;
      local_a8._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"translate me","");
      pcVar3 = (char *)0x0;
      bVar2 = RangeMap::AddRangeWithTranslation
                        (local_38,0xf,8,(string *)local_a8,this_00,false,other);
      local_c0[0] = (internal)!bVar2;
      local_b8 = (pointer)0x0;
      if ((char *)local_a8._0_8_ != pcVar4) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      iVar1 = local_c0[0];
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_c0,
                   (AssertionResult *)
                   "map2_.AddRangeWithTranslation(15, 8, \"translate me\", map_, false, &map3_)",
                   "true","false",pcVar3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                   ,0x155,(char *)local_a8._0_8_);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((char *)local_a8._0_8_ != pcVar4) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
        if (local_d0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_d0._M_head_impl + 8))();
        }
      }
      if (local_b8 != (pointer)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      }
      if (iVar1 != (internal)0x0) {
        pcVar4 = local_a8 + 0x10;
        local_a8._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"translate me","");
        pcVar3 = (char *)0x0;
        bVar2 = RangeMap::AddRangeWithTranslation
                          (local_38,0x16,0xf,(string *)local_a8,this_00,false,other);
        local_c0[0] = (internal)!bVar2;
        local_b8 = (pointer)0x0;
        if ((char *)local_a8._0_8_ != pcVar4) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
        iVar1 = local_c0[0];
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a8,(internal *)local_c0,
                     (AssertionResult *)
                     "map2_.AddRangeWithTranslation(22, 15, \"translate me\", map_, false, &map3_)",
                     "true","false",pcVar3);
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                     ,0x159,(char *)local_a8._0_8_);
          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c8);
          if ((char *)local_a8._0_8_ != pcVar4) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          }
          if (local_d0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_d0._M_head_impl + 8))();
          }
        }
        if (local_b8 != (pointer)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
        }
        if (iVar1 != (internal)0x0) {
          local_a8._0_8_ = local_a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"translate me","");
          pcVar4 = (char *)0x0;
          bVar2 = RangeMap::AddRangeWithTranslation
                            (local_38,0x14,1000,(string *)local_a8,this_00,false,other);
          local_c0[0] = (internal)!bVar2;
          local_b8 = (pointer)0x0;
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          }
          if (local_c0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a8,(internal *)local_c0,
                       (AssertionResult *)
                       "map2_.AddRangeWithTranslation(20, 1000, \"translate me\", map_, false, &map3_)"
                       ,"true","false",pcVar4);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                       ,0x15d,(char *)local_a8._0_8_);
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_c8);
            if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
              operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            }
            if (local_d0._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_d0._M_head_impl + 8))();
            }
          }
          if (local_b8 != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(RangeMapTest, Translation) {
  map_.AddDualRange(20, 5, 120, "foo");
  CheckConsistency();
  AssertMainMapEquals({
    {20, 25, 120, "foo"}
  });

  ASSERT_TRUE(map2_.AddRangeWithTranslation(20, 5, "translate me", map_, false,
                                            &map3_));

  CheckConsistency();
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"}
  });

  map_.AddDualRange(1000, 30, 1100, "bar");
  ASSERT_TRUE(map2_.AddRangeWithTranslation(1000, 5, "translate me2", map_,
                                            false, &map3_));
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"},
    {1000, 1005, kNoTranslation, "translate me2"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"},
    {1100, 1105, kNoTranslation, "translate me2"}
  });

  // Starts before base map.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(15, 8, "translate me", map_, false,
                                             &map3_));

  // Extends past base map.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(22, 15, "translate me", map_,
                                             false, &map3_));

  // Starts and ends in base map, but skips range in the middle.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(20, 1000, "translate me", map_,
                                             false, &map3_));
}